

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatEdge.c
# Opt level: O3

void Seg_ManCreateCnf(Seg_Man_t *p,int fTwo,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  undefined8 uVar2;
  int *piVar3;
  void *__ptr;
  Seg_Man_t *pSVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Gia_Man_t *pGVar10;
  Vec_Int_t *pVVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  Tim_Man_t *pTVar19;
  Vec_Wec_t *pVVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  int pLits [3];
  timespec ts;
  int local_cc;
  int local_c8;
  int local_c4;
  ulong local_c0;
  Seg_Man_t *local_b8;
  ulong local_b0;
  int local_a4;
  long local_a0;
  Tim_Man_t *local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  int local_64;
  long local_60;
  Vec_Wec_t *local_58;
  int local_4c;
  int local_48;
  int local_44;
  timespec local_40;
  
  pTVar19 = (Tim_Man_t *)p->pGia->pManTime;
  local_64 = fVerbose;
  local_48 = fTwo;
  iVar5 = clock_gettime(3,&local_40);
  if (iVar5 < 0) {
    local_60 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    local_60 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  local_4c = sat_solver_nclauses(p->pSat);
  pGVar10 = p->pGia;
  local_b8 = p;
  if (pGVar10->nObjs < 1) {
    local_b0 = 0;
  }
  else {
    lVar14 = 0;
    local_b0 = 0;
    local_98 = pTVar19;
    do {
      if (pGVar10->pObjs == (Gia_Obj_t *)0x0) break;
      if ((p->vFirsts->nSize <= lVar14) || (p->vNvars->nSize <= lVar14)) goto LAB_00751a0d;
      uVar6 = p->vFirsts->pArray[lVar14];
      local_c0 = (ulong)uVar6;
      local_90 = CONCAT44(local_90._4_4_,p->vNvars->pArray[lVar14]);
      local_a0 = lVar14;
      if (pTVar19 == (Tim_Man_t *)0x0) {
LAB_0075115c:
        pVVar11 = pGVar10->vMapping;
        lVar12 = (long)pVVar11->nSize;
        if (lVar12 <= lVar14) {
LAB_00751a0d:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (pVVar11->pArray[lVar14] != 0) {
          local_a4 = uVar6 * 2;
          local_44 = uVar6 * 2 + 2;
          pVVar20 = (Vec_Wec_t *)0x0;
          while( true ) {
            piVar3 = pVVar11->pArray;
            lVar24 = (long)piVar3[lVar14];
            if ((lVar24 < 0) || ((uint)lVar12 <= (uint)piVar3[lVar14])) goto LAB_00751a0d;
            if ((long)piVar3[lVar24] <= (long)pVVar20) break;
            uVar6 = piVar3[(long)((long)&pVVar20->nCap + lVar24 + 1)];
            if (pTVar19 == (Tim_Man_t *)0x0) {
              if ((int)uVar6 < 0) goto LAB_00751a2c;
              iVar5 = pGVar10->nObjs;
LAB_007512b9:
              if (iVar5 <= (int)uVar6) goto LAB_00751a2c;
              if ((~*(uint *)(pGVar10->pObjs + uVar6) & 0x1fffffff) != 0 &&
                  -1 < (int)*(uint *)(pGVar10->pObjs + uVar6)) {
                if (p->vFirsts->nSize <= (int)uVar6) goto LAB_00751a0d;
                iVar5 = (int)local_b0;
                if (p->vNvars->nSize <= (int)uVar6) goto LAB_00751a0d;
                iVar7 = p->vNvars->pArray[uVar6];
                if ((iVar7 == 1) || ((int)local_90 <= iVar7)) {
                  __assert_fail("nVars != 1 && nVars < nVarsLut",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatEdge.c"
                                ,0x138,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
                }
                local_58 = pVVar20;
                if (iVar7 == 0) {
                  uVar17 = local_70;
                  if (iVar5 < 0) goto LAB_00751953;
                  local_cc = iVar5 * 2 + 1;
                  if ((int)local_c0 < 0) goto LAB_00751953;
                  local_c8 = local_a4;
                  iVar7 = sat_solver_addclause(p->pSat,&local_cc,&local_c4);
                  if (iVar7 == 0) {
                    __assert_fail("value",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatEdge.c"
                                  ,0x13f,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
                  }
                  local_cc = iVar5 * 2;
                  local_c8 = local_44;
                  iVar7 = sat_solver_addclause(p->pSat,&local_cc,&local_c4);
                  if (iVar7 == 0) {
                    __assert_fail("value",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatEdge.c"
                                  ,0x144,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
                  }
                }
                else if (0 < iVar7) {
                  uVar6 = p->vFirsts->pArray[uVar6];
                  local_78 = (ulong)uVar6;
                  local_88 = CONCAT44(local_88._4_4_,iVar5 * 2);
                  local_80 = CONCAT44(local_80._4_4_,iVar5 * 2 + 1);
                  iVar8 = uVar6 * 2 + 1;
                  uVar23 = local_c0 & 0xffffffff;
                  iVar15 = local_a4;
                  do {
                    pSVar4 = local_b8;
                    uVar17 = local_70;
                    if (((int)local_78 < 0) || (local_cc = iVar8, (int)local_b0 < 0))
                    goto LAB_00751953;
                    local_c8 = (uint)local_80;
                    if ((int)uVar23 < 0) goto LAB_00751953;
                    local_70 = CONCAT44(local_70._4_4_,iVar7);
                    local_c4 = iVar15;
                    iVar5 = sat_solver_addclause(local_b8->pSat,&local_cc,(lit *)&local_c0);
                    if (iVar5 == 0) {
                      __assert_fail("value",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatEdge.c"
                                    ,0x14d,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
                    }
                    local_c8 = (int)local_88;
                    iVar15 = iVar15 + 2;
                    local_cc = iVar8;
                    local_c4 = iVar15;
                    iVar5 = sat_solver_addclause(pSVar4->pSat,&local_cc,(lit *)&local_c0);
                    if (iVar5 == 0) {
                      __assert_fail("value",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatEdge.c"
                                    ,0x153,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
                    }
                    uVar23 = (ulong)((int)uVar23 + 1);
                    iVar8 = iVar8 + 2;
                    iVar7 = (int)local_70 + -1;
                    iVar5 = (int)local_b0;
                  } while (iVar7 != 0);
                }
                local_b0 = (ulong)(iVar5 + 1);
                p = local_b8;
                pTVar19 = local_98;
                pVVar20 = local_58;
                lVar14 = local_a0;
              }
            }
            else {
              if (((int)uVar6 < 0) || (iVar5 = pGVar10->nObjs, iVar5 <= (int)uVar6))
              goto LAB_00751a2c;
              if (((undefined1  [12])pGVar10->pObjs[uVar6] & (undefined1  [12])0x9fffffff) !=
                  (undefined1  [12])0x9fffffff) goto LAB_007512b9;
              if ((p->vFirsts->nSize <= (int)uVar6) || (p->vNvars->nSize <= (int)uVar6))
              goto LAB_00751a0d;
              iVar5 = p->vNvars->pArray[uVar6];
              if ((int)local_90 < iVar5) {
                __assert_fail("nVars <= nVarsLut",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatEdge.c"
                              ,0x128,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
              }
              pTVar19 = local_98;
              if (0 < iVar5) {
                iVar15 = p->vFirsts->pArray[uVar6];
                iVar7 = iVar15 * 2 + 1;
                uVar23 = local_c0 & 0xffffffff;
                iVar8 = local_a4;
                do {
                  uVar17 = local_70;
                  if ((iVar15 < 0) || (local_cc = iVar7, (int)uVar23 < 0)) goto LAB_00751953;
                  local_c8 = iVar8;
                  iVar9 = sat_solver_addclause(local_b8->pSat,&local_cc,&local_c4);
                  if (iVar9 == 0) {
                    __assert_fail("value",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatEdge.c"
                                  ,0x130,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
                  }
                  iVar8 = iVar8 + 2;
                  uVar23 = (ulong)((int)uVar23 + 1);
                  iVar7 = iVar7 + 2;
                  iVar5 = iVar5 + -1;
                  p = local_b8;
                  pTVar19 = local_98;
                  lVar14 = local_a0;
                } while (iVar5 != 0);
              }
            }
            pVVar20 = (Vec_Wec_t *)((long)&pVVar20->nCap + 1);
            pGVar10 = p->pGia;
            pVVar11 = pGVar10->vMapping;
            lVar12 = (long)pVVar11->nSize;
            if (lVar12 <= lVar14) goto LAB_00751a0d;
          }
        }
      }
      else {
        pGVar1 = pGVar10->pObjs + lVar14;
        uVar2 = *(undefined8 *)pGVar1;
        if (((uint)uVar2 & 0x9fffffff) != 0x9fffffff) goto LAB_0075115c;
        iVar5 = Tim_ManBoxForCi(pTVar19,(uint)((ulong)uVar2 >> 0x20) & 0x1fffffff);
        if ((0 < (int)local_90) && (-1 < iVar5)) {
          uVar6 = Tim_ManBoxOutputFirst(pTVar19,iVar5);
          uVar2 = *(undefined8 *)pGVar1;
          if (-1 < (int)uVar2) {
            __assert_fail("pObj->fTerm",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1b8,"int Gia_ObjCioId(Gia_Obj_t *)");
          }
          if (uVar6 == ((uint)((ulong)uVar2 >> 0x20) & 0x1fffffff)) {
            iVar7 = Tim_ManBoxInputNum(pTVar19,iVar5);
            uVar6 = Tim_ManBoxInputFirst(pTVar19,iVar5);
            if (1 < iVar7) {
              local_78 = (ulong)(iVar7 - 1);
              local_70 = (ulong)uVar6;
              local_88 = CONCAT44(local_88._4_4_,(int)local_c0 * 2 + 2);
              uVar23 = 0;
              local_80 = CONCAT44(local_80._4_4_,uVar6);
              do {
                if ((int)uVar6 < 0) goto LAB_00751a0d;
                pGVar10 = p->pGia;
                if (pGVar10->vCos->nSize <= (int)(local_70 + uVar23)) goto LAB_00751a0d;
                iVar5 = pGVar10->vCos->pArray[local_70 + uVar23];
                if (((long)iVar5 < 0) || (pGVar10->nObjs <= iVar5)) goto LAB_00751a2c;
                uVar6 = iVar5 - (*(uint *)(pGVar10->pObjs + iVar5) & 0x1fffffff);
                if ((((int)uVar6 < 0) || (p->vFirsts->nSize <= (int)uVar6)) ||
                   (p->vNvars->nSize <= (int)uVar6)) goto LAB_00751a0d;
                iVar5 = p->vNvars->pArray[uVar6];
                if ((int)local_90 <= iVar5) {
                  __assert_fail("nVars < nVarsLut",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatEdge.c"
                                ,0x101,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
                }
                if (0 < iVar5) {
                  iVar15 = p->vFirsts->pArray[uVar6];
                  iVar7 = iVar15 * 2 + 1;
                  uVar16 = local_c0 & 0xffffffff;
                  uVar21 = local_88 & 0xffffffff;
                  do {
                    uVar17 = local_70;
                    if ((iVar15 < 0) || (local_cc = iVar7, (int)uVar16 < -1)) goto LAB_00751953;
                    local_c8 = (int)uVar21;
                    iVar8 = sat_solver_addclause(local_b8->pSat,&local_cc,&local_c4);
                    if (iVar8 == 0) {
                      __assert_fail("value",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatEdge.c"
                                    ,0x108,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
                    }
                    uVar21 = (ulong)((int)uVar21 + 2);
                    uVar16 = (ulong)((int)uVar16 + 1);
                    iVar7 = iVar7 + 2;
                    iVar5 = iVar5 + -1;
                  } while (iVar5 != 0);
                }
                uVar23 = uVar23 + 1;
                p = local_b8;
                pTVar19 = local_98;
                lVar14 = local_a0;
                uVar6 = (uint)local_80;
              } while (uVar23 != local_78);
            }
          }
          else {
            if ((int)uVar6 < 0) goto LAB_00751a0d;
            pVVar11 = p->pGia->vCis;
            if (pVVar11->nSize <= (int)uVar6) goto LAB_00751a0d;
            iVar5 = pVVar11->pArray[uVar6];
            lVar12 = (long)iVar5;
            if ((lVar12 < 0) || (p->pGia->nObjs <= iVar5)) {
LAB_00751a2c:
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            if ((p->vFirsts->nSize <= iVar5) || (p->vNvars->nSize <= iVar5)) goto LAB_00751a0d;
            iVar5 = p->vNvars->pArray[lVar12];
            if (0 < iVar5) {
              iVar15 = p->vFirsts->pArray[lVar12];
              iVar8 = (int)local_c0 * 2;
              iVar7 = iVar15 * 2 + 1;
              do {
                uVar17 = local_70;
                if ((iVar15 < 0) || (local_cc = iVar7, (int)local_c0 < 0)) goto LAB_00751953;
                local_c8 = iVar8;
                iVar9 = sat_solver_addclause(local_b8->pSat,&local_cc,&local_c4);
                if (iVar9 == 0) {
                  __assert_fail("value",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatEdge.c"
                                ,0x11a,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
                }
                iVar8 = iVar8 + 2;
                local_c0 = (ulong)((int)local_c0 + 1);
                iVar7 = iVar7 + 2;
                iVar5 = iVar5 + -1;
                p = local_b8;
                lVar14 = local_a0;
              } while (iVar5 != 0);
            }
          }
        }
      }
      lVar14 = lVar14 + 1;
      pGVar10 = p->pGia;
    } while (lVar14 < pGVar10->nObjs);
  }
  if ((int)local_b0 != p->nVars) {
    __assert_fail("Count == p->nVars",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatEdge.c"
                  ,0x158,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
  }
  if (local_64 != 0) {
    iVar5 = sat_solver_nclauses(p->pSat);
    printf("Delay constraints = %d. ",(ulong)(uint)(iVar5 - local_4c));
  }
  iVar5 = sat_solver_nclauses(p->pSat);
  local_a0 = CONCAT44(local_a0._4_4_,iVar5);
  local_58 = Seg_ManCollectObjEdges(p->vEdges,p->pGia->nObjs);
  local_90 = (ulong)local_58->nSize;
  pTVar19 = (Tim_Man_t *)local_58->pArray;
  if (0 < (long)local_90) {
    uVar23 = 0;
    local_98 = (Tim_Man_t *)local_58->pArray;
    do {
      pTVar19 = local_98;
      lVar14 = uVar23 * 0x10;
      iVar5 = *(int *)((long)&local_98->vBoxes + lVar14 + 4);
      local_c0 = uVar23;
      if (local_48 == 0) {
        if (1 < iVar5) goto LAB_0075174f;
      }
      else if (iVar5 < 0xb) {
        if (2 < iVar5) {
          uVar21 = 2;
          uVar17 = 1;
          uVar16 = 0;
          do {
            uVar18 = uVar16 + 1;
            lVar12 = (long)iVar5;
            if ((long)uVar18 < lVar12) {
              uVar6 = (&(&pTVar19->vDelayTables)[uVar23 * 2]->nCap)[uVar16];
              local_b0 = (ulong)uVar6;
              iVar7 = uVar6 * 2 + 1;
              local_70 = uVar17;
              local_88 = uVar18;
              local_80 = uVar17;
              local_78 = uVar21;
              do {
                uVar17 = local_70 + 1;
                if ((int)uVar17 < iVar5) {
                  if ((int)local_b0 < 0) goto LAB_00751953;
                  iVar8 = (&(&pTVar19->vDelayTables)[uVar23 * 2]->nCap)[local_70];
                  iVar15 = iVar8 * 2 + 1;
                  uVar16 = uVar21;
                  local_70 = uVar17;
                  do {
                    iVar5 = (&(&pTVar19->vDelayTables)[uVar23 * 2]->nCap)[uVar16];
                    local_cc = iVar7;
                    uVar17 = local_70;
                    if ((iVar8 < 0) || (local_c8 = iVar15, iVar5 < 0)) goto LAB_00751953;
                    local_c4 = iVar5 * 2 + 1;
                    iVar5 = sat_solver_addclause(local_b8->pSat,&local_cc,(lit *)&local_c0);
                    if (iVar5 == 0) {
                      __assert_fail("value",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatEdge.c"
                                    ,0x185,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
                    }
                    uVar16 = uVar16 + 1;
                    iVar5 = *(int *)((long)&pTVar19->vBoxes + lVar14 + 4);
                    uVar17 = local_70;
                  } while ((int)uVar16 < iVar5);
                }
                local_70 = uVar17;
                uVar21 = uVar21 + 1;
              } while ((int)local_70 < iVar5);
              lVar12 = (long)iVar5;
              p = local_b8;
              uVar17 = local_80;
              uVar18 = local_88;
              uVar21 = local_78;
            }
            uVar21 = uVar21 + 1;
            uVar17 = uVar17 + 1;
            uVar16 = uVar18;
          } while ((long)uVar18 < lVar12);
        }
      }
      else {
LAB_0075174f:
        lVar24 = 1;
        lVar12 = 0;
        do {
          lVar22 = lVar12 + 1;
          lVar13 = (long)iVar5;
          if (lVar22 < lVar13) {
            iVar5 = (&(&pTVar19->vDelayTables)[uVar23 * 2]->nCap)[lVar12];
            uVar17 = local_70;
            if (iVar5 < 0) goto LAB_00751953;
            iVar7 = iVar5 * 2 + 1;
            lVar12 = lVar24;
            do {
              iVar5 = (&(&pTVar19->vDelayTables)[uVar23 * 2]->nCap)[lVar12];
              local_cc = iVar7;
              uVar17 = local_70;
              if (iVar5 < 0) goto LAB_00751953;
              local_c8 = iVar5 * 2 + 1;
              iVar5 = sat_solver_addclause(p->pSat,&local_cc,&local_c4);
              if (iVar5 == 0) {
                __assert_fail("value",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatEdge.c"
                              ,0x178,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
              }
              lVar12 = lVar12 + 1;
              iVar5 = *(int *)((long)&pTVar19->vBoxes + lVar14 + 4);
            } while ((int)lVar12 < iVar5);
            lVar13 = (long)iVar5;
          }
          lVar24 = lVar24 + 1;
          lVar12 = lVar22;
        } while (lVar22 < lVar13);
      }
      uVar23 = local_c0 + 1;
      pTVar19 = local_98;
    } while (uVar23 != local_90);
  }
  pVVar20 = local_58;
  iVar5 = local_58->nCap;
  if ((long)iVar5 < 1) {
    if (pTVar19 == (Tim_Man_t *)0x0) goto LAB_0075182f;
  }
  else {
    lVar14 = 0;
    do {
      __ptr = *(void **)((long)&pTVar19->vDelayTables + lVar14);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&pTVar19->vDelayTables + lVar14) = 0;
      }
      lVar14 = lVar14 + 0x10;
    } while ((long)iVar5 * 0x10 != lVar14);
  }
  free(pTVar19);
LAB_0075182f:
  free(pVVar20);
  pVVar11 = p->vToSkip;
  if (0 < pVVar11->nSize) {
    lVar14 = 0;
    do {
      uVar17 = local_70;
      if (pVVar11->pArray[lVar14] < 0) {
LAB_00751953:
        local_70 = uVar17;
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf1,"int Abc_Var2Lit(int, int)");
      }
      local_cc = pVVar11->pArray[lVar14] * 2 + 1;
      iVar5 = sat_solver_addclause(p->pSat,&local_cc,&local_c8);
      if (iVar5 == 0) {
        __assert_fail("value",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatEdge.c"
                      ,399,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
      }
      lVar14 = lVar14 + 1;
      pVVar11 = p->vToSkip;
    } while (lVar14 < pVVar11->nSize);
  }
  if (local_64 != 0) {
    iVar5 = sat_solver_nclauses(p->pSat);
    printf("Edge constraints = %d. ",(ulong)(uint)(iVar5 - (int)local_a0));
    iVar7 = 3;
    iVar5 = clock_gettime(3,&local_40);
    if (iVar5 < 0) {
      lVar14 = -1;
    }
    else {
      lVar14 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    lVar14 = lVar14 + local_60;
    Abc_Print(iVar7,"%s =","Time");
    Abc_Print(iVar7,"%9.2f sec\n",(double)lVar14 / 1000000.0);
  }
  return;
}

Assistant:

void Seg_ManCreateCnf( Seg_Man_t * p, int fTwo, int fVerbose )
{
    Tim_Man_t * pTim = (Tim_Man_t *)p->pGia->pManTime;
    Gia_Obj_t * pObj;
    Vec_Wec_t * vObjEdges;
    Vec_Int_t * vLevel;
    int iLut, iFanin, iFirst;
    int pLits[3], Count = 0;
    int i, k, nVars, Edge, value;
    abctime clk = Abc_Clock();
    // edge delay constraints
    int nConstr = sat_solver_nclauses(p->pSat);
    Gia_ManForEachObj( p->pGia, pObj, iLut )
    {
        int iFirstLut = Vec_IntEntry( p->vFirsts, iLut );
        int nVarsLut  = Vec_IntEntry( p->vNvars, iLut );
        if ( pTim && Gia_ObjIsCi(pObj) )
        {
            int iBox = Tim_ManBoxForCi( pTim, Gia_ObjCioId(pObj) );
            if ( nVarsLut > 0 && iBox >= 0 )
            {
                int iCiId = Tim_ManBoxOutputFirst( pTim, iBox );
                if ( iCiId == Gia_ObjCioId(pObj) ) // first input
                {
                    int nIns = Tim_ManBoxInputNum( pTim, iBox );
                    int iIn0 = Tim_ManBoxInputFirst( pTim, iBox );
                    for ( i = 0; i < nIns-1; i++ ) // skip carry-in pin
                    {
                        Gia_Obj_t * pOut = Gia_ManCo( p->pGia, iIn0+i );
                        int iDriverId = Gia_ObjFaninId0p( p->pGia, pOut );
                        int AddOn;

                        iFirst = Vec_IntEntry( p->vFirsts, iDriverId );
                        nVars  = Vec_IntEntry( p->vNvars, iDriverId );
                        assert( nVars < nVarsLut );
                        AddOn = (int)(nVars < nVarsLut);
                        for ( k = 0; k < nVars; k++ )
                        {
                            pLits[0] = Abc_Var2Lit( iFirst+k, 1 );
                            pLits[1] = Abc_Var2Lit( iFirstLut+k+AddOn, 0 );
                            value = sat_solver_addclause( p->pSat, pLits, pLits+2 );
                            assert( value );
                        }
                    }
                }
                else // intermediate input
                {
                    Gia_Obj_t * pIn = Gia_ManCi( p->pGia, iCiId );
                    int iObjId = Gia_ObjId( p->pGia, pIn );

                    iFirst = Vec_IntEntry( p->vFirsts, iObjId );
                    nVars  = Vec_IntEntry( p->vNvars, iObjId );
                    if ( nVars > 0 )
                    {
                        for ( k = 0; k < nVars; k++ )
                        {
                            pLits[0] = Abc_Var2Lit( iFirst+k, 1 );
                            pLits[1] = Abc_Var2Lit( iFirstLut+k, 0 );
                            value = sat_solver_addclause( p->pSat, pLits, pLits+2 );
                            assert( value );
                        }
                    }
                }
            }
            continue;
        }
        if ( !Gia_ObjIsLut(p->pGia, iLut) )
            continue;
        Gia_LutForEachFanin( p->pGia, iLut, iFanin, i )
            if ( pTim && Gia_ObjIsCi(Gia_ManObj(p->pGia, iFanin)) )
            {
                iFirst = Vec_IntEntry( p->vFirsts, iFanin );
                nVars  = Vec_IntEntry( p->vNvars, iFanin );
                assert( nVars <= nVarsLut );
                if ( nVars > 0 )
                {
                    for ( k = 0; k < nVars; k++ )
                    {
                        pLits[0] = Abc_Var2Lit( iFirst+k, 1 );
                        pLits[1] = Abc_Var2Lit( iFirstLut+k, 0 );
                        value = sat_solver_addclause( p->pSat, pLits, pLits+2 );
                        assert( value );
                    }
                }
            }
            else if ( Gia_ObjIsAnd(Gia_ManObj(p->pGia, iFanin)) )
            {
                iFirst = Vec_IntEntry( p->vFirsts, iFanin );
                nVars  = Vec_IntEntry( p->vNvars, iFanin );
                assert( nVars != 1 && nVars < nVarsLut );
                // add initial
                if ( nVars == 0 )
                {
                    pLits[0] = Abc_Var2Lit( Count, 1 );
                    pLits[1] = Abc_Var2Lit( iFirstLut, 0 );
                    value = sat_solver_addclause( p->pSat, pLits, pLits+2 );
                    assert( value );

                    pLits[0] = Abc_Var2Lit( Count, 0 );
                    pLits[1] = Abc_Var2Lit( iFirstLut+1, 0 );
                    value = sat_solver_addclause( p->pSat, pLits, pLits+2 );
                    assert( value );
                }
                // add others
                for ( k = 0; k < nVars; k++ )
                {
                    pLits[0] = Abc_Var2Lit( iFirst+k, 1 );
                    pLits[1] = Abc_Var2Lit( Count, 1 );
                    pLits[2] = Abc_Var2Lit( iFirstLut+k, 0 );
                    value = sat_solver_addclause( p->pSat, pLits, pLits+3 );
                    assert( value );

                    pLits[0] = Abc_Var2Lit( iFirst+k, 1 );
                    pLits[1] = Abc_Var2Lit( Count, 0 );
                    pLits[2] = Abc_Var2Lit( iFirstLut+k+1, 0 );
                    value = sat_solver_addclause( p->pSat, pLits, pLits+3 );
                    assert( value );
                }
                Count++;
            }
    }
    assert( Count == p->nVars );
    if ( fVerbose )
    printf( "Delay constraints = %d. ", sat_solver_nclauses(p->pSat) - nConstr );
    nConstr = sat_solver_nclauses(p->pSat);
/*
    // delay relationship constraints
    Vec_IntForEachEntryTwo( p->vFirsts, p->vNvars, iFirst, nVars, iLut )
    {
        if ( nVars < 2 )
            continue;
        for ( i = 1; i < nVars; i++ )
        {
            pLits[0] = Abc_Var2Lit( iFirst + i - 1, 1 );
            pLits[1] = Abc_Var2Lit( iFirst + i,     0 );
            value = sat_solver_addclause( p->pSat, pLits, pLits+2 );
            assert( value );
        }
    }
*/
    // edge compatibility constraint
    vObjEdges = Seg_ManCollectObjEdges( p->vEdges, Gia_ManObjNum(p->pGia) );
    Vec_WecForEachLevel( vObjEdges, vLevel, i )
    {
        int v1, v2, v3, Var1, Var2, Var3;
        if ( (!fTwo && Vec_IntSize(vLevel) >= 2) || (fTwo && Vec_IntSize(vLevel) > 10) )
        {
            Vec_IntForEachEntry( vLevel, Var1, v1 )
            Vec_IntForEachEntryStart( vLevel, Var2, v2, v1 + 1 )
            {
                pLits[0] = Abc_Var2Lit( Var1, 1 );
                pLits[1] = Abc_Var2Lit( Var2, 1 );
                value = sat_solver_addclause( p->pSat, pLits, pLits+2 );
                assert( value );
            }
        }
        else if ( fTwo && Vec_IntSize(vLevel) >= 3 )
        {
            Vec_IntForEachEntry( vLevel, Var1, v1 )
            Vec_IntForEachEntryStart( vLevel, Var2, v2, v1 + 1 )
            Vec_IntForEachEntryStart( vLevel, Var3, v3, v2 + 1 )
            {
                pLits[0] = Abc_Var2Lit( Var1, 1 );
                pLits[1] = Abc_Var2Lit( Var2, 1 );
                pLits[2] = Abc_Var2Lit( Var3, 1 );
                value = sat_solver_addclause( p->pSat, pLits, pLits+3 );
                assert( value );
            }
        }
    }
    Vec_WecFree( vObjEdges );
    // block forbidden edges
    Vec_IntForEachEntry( p->vToSkip, Edge, i )
    {
        pLits[0] = Abc_Var2Lit( Edge, 1 );
        value = sat_solver_addclause( p->pSat, pLits, pLits+1 );
        assert( value );
    }
    if ( fVerbose )
    printf( "Edge constraints = %d. ", sat_solver_nclauses(p->pSat) - nConstr );
    if ( fVerbose )
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}